

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O0

int mriStep_NlsResidual(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  N_Vector X [3];
  sunrealtype c [3];
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  undefined8 local_58;
  undefined8 local_50;
  ulong local_48;
  int local_34;
  long local_30;
  long local_28;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_34 = mriStep_AccessARKODEStepMem
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88,(ARKodeMRIStepMem *)0x167c2e);
  local_4 = local_34;
  if (local_34 == 0) {
    N_VLinearSum(*(undefined8 *)(local_30 + 0x80),local_10,*(undefined8 *)(local_28 + 0x228));
    local_34 = (**(code **)(local_30 + 0xa8))
                         (*(undefined8 *)(local_28 + 0x2d0),*(undefined8 *)(local_28 + 0x228),
                          *(undefined8 *)
                           (*(long *)(local_30 + 0x30) +
                           (long)*(int *)(*(long *)(local_30 + 0x58) +
                                         (long)*(int *)(local_30 + 0x90) * 4) * 8),
                          *(undefined8 *)(local_28 + 0x10));
    *(long *)(local_30 + 0x178) = *(long *)(local_30 + 0x178) + 1;
    if (local_34 < 0) {
      local_4 = -8;
    }
    else if (local_34 < 1) {
      local_58 = 0x3ff0000000000000;
      local_50 = 0xbff0000000000000;
      local_48 = *(ulong *)(local_30 + 0xb0) ^ 0x8000000000000000;
      iVar1 = N_VLinearCombination(3,&local_58,&stack0xffffffffffffff88,local_18);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
    else {
      local_4 = 9;
    }
  }
  return local_4;
}

Assistant:

int mriStep_NlsResidual(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;
  sunrealtype c[3];
  N_Vector X[3];

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute slow implicit RHS and save for later */
  retval = step_mem->nls_fsi(ark_mem->tcur, ark_mem->ycur,
                             step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                             ark_mem->user_data);
  step_mem->nfsi++;
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  /* compute residual: zcor - gamma*Fsi - sdata */
  c[0]   = ONE;
  X[0]   = zcor;
  c[1]   = -ONE;
  X[1]   = step_mem->sdata;
  c[2]   = -step_mem->gamma;
  X[2]   = step_mem->Fsi[step_mem->stage_map[step_mem->istage]];
  retval = N_VLinearCombination(3, c, X, r);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }
  return (ARK_SUCCESS);
}